

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::UntypedMapBase::TableEntryIsTooLong(UntypedMapBase *this,map_index_t b)

{
  undefined1 extraout_AL;
  ulong *puVar1;
  string *psVar2;
  ulong unaff_RBX;
  UntypedMapBase *this_00;
  
  this_00 = (UntypedMapBase *)&stack0xffffffffffffffe8;
  puVar1 = (ulong *)this->table_[b];
  if (((ulong)puVar1 & 1) == 0) {
    unaff_RBX = 0;
    do {
      unaff_RBX = unaff_RBX + 1;
      puVar1 = (ulong *)*puVar1;
    } while (puVar1 != (ulong *)0x0);
    if (unaff_RBX < 9) {
      psVar2 = (string *)0x0;
      goto LAB_001bcd96;
    }
  }
  else {
    TableEntryIsTooLong((UntypedMapBase *)&stack0xffffffffffffffe8);
  }
  psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                     (unaff_RBX,8,"count <= kMaxLength");
LAB_001bcd96:
  if (psVar2 == (string *)0x0) {
    return 7 < unaff_RBX;
  }
  TableEntryIsTooLong();
  if (this_00->num_buckets_ != 1) {
    ClearTable(this_00,(ClearInput)ZEXT816(0x500480028));
  }
  return (bool)extraout_AL;
}

Assistant:

bool TableEntryIsTooLong(map_index_t b) {
    return internal::TableEntryIsTooLong(TableEntryToNode(table_[b]));
  }